

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O3

bool __thiscall
Js::InlineCache::GetCallApplyTarget
          (InlineCache *this,RecyclableObject *obj,RecyclableObject **callee)

{
  ushort uVar1;
  Type *pTVar2;
  Type *pTVar3;
  bool bVar4;
  Var pvVar5;
  DynamicObject *pDVar6;
  RecyclableObject *pRVar7;
  
  pTVar2 = (obj->type).ptr;
  *callee = (RecyclableObject *)0x0;
  if ((undefined1  [24])((undefined1  [24])this->u & (undefined1  [24])0x1) == (undefined1  [24])0x0
     ) {
    if ((undefined1  [24])((undefined1  [24])this->u & (undefined1  [24])0x1) ==
        (undefined1  [24])0x0) {
      return false;
    }
    pTVar3 = (this->u).local.typeWithoutProperty;
    if (pTVar2 == pTVar3) {
      pDVar6 = (this->u).proto.prototypeObject;
      uVar1 = (this->u).proto.slotIndex;
      goto LAB_00971164;
    }
    if (pTVar3 != (Type *)((ulong)pTVar2 | 4)) {
      return false;
    }
    pvVar5 = DynamicObject::GetAuxSlot
                       ((this->u).proto.prototypeObject,(uint)(this->u).proto.slotIndex);
  }
  else {
    pTVar3 = (this->u).local.type;
    if (pTVar2 != pTVar3) {
      if (pTVar3 != (Type *)((ulong)pTVar2 | 4)) {
        return false;
      }
      pDVar6 = VarTo<Js::DynamicObject,Js::RecyclableObject>(obj);
      pvVar5 = DynamicObject::GetAuxSlot(pDVar6,(uint)(this->u).local.slotIndex);
      bVar4 = VarIs<Js::RecyclableObject>(pvVar5);
      if (!bVar4) {
        return false;
      }
      pDVar6 = VarTo<Js::DynamicObject,Js::RecyclableObject>(obj);
      pvVar5 = DynamicObject::GetAuxSlot(pDVar6,(uint)(this->u).local.slotIndex);
      goto LAB_00971178;
    }
    pDVar6 = VarTo<Js::DynamicObject,Js::RecyclableObject>(obj);
    uVar1 = (this->u).local.slotIndex;
LAB_00971164:
    pvVar5 = DynamicObject::GetInlineSlot(pDVar6,(uint)uVar1);
  }
  bVar4 = VarIs<Js::RecyclableObject>(pvVar5);
  if (!bVar4) {
    return false;
  }
LAB_00971178:
  pRVar7 = VarTo<Js::RecyclableObject>(pvVar5);
  *callee = pRVar7;
  return true;
}

Assistant:

bool InlineCache::GetCallApplyTarget(RecyclableObject* obj, RecyclableObject **callee)
    {
        Type *const type = obj->GetType();
        Type *const taggedType = TypeWithAuxSlotTag(type);
        *callee = nullptr;

        if (IsLocal())
        {
            if (type == u.local.type)
            {
                const Var objectAtInlineSlot = VarTo<DynamicObject>(obj)->GetInlineSlot(u.local.slotIndex);
                if (!Js::TaggedNumber::Is(objectAtInlineSlot))
                {
                    *callee = VarTo<RecyclableObject>(objectAtInlineSlot);
                    return true;
                }
            }
            else if (taggedType == u.local.type)
            {
                const Var objectAtAuxSlot = VarTo<DynamicObject>(obj)->GetAuxSlot(u.local.slotIndex);
                if (!Js::TaggedNumber::Is(objectAtAuxSlot))
                {
                    *callee = VarTo<RecyclableObject>(VarTo<DynamicObject>(obj)->GetAuxSlot(u.local.slotIndex));
                    return true;
                }
            }
            return false;
        }
        else if (IsProto())
        {
            if (type == u.proto.type)
            {
                const Var objectAtInlineSlot = u.proto.prototypeObject->GetInlineSlot(u.proto.slotIndex);
                if (!Js::TaggedNumber::Is(objectAtInlineSlot))
                {
                    *callee = VarTo<RecyclableObject>(objectAtInlineSlot);
                    return true;
                }
            }
            else if (taggedType == u.proto.type)
            {
                const Var objectAtAuxSlot = u.proto.prototypeObject->GetAuxSlot(u.proto.slotIndex);
                if (!Js::TaggedNumber::Is(objectAtAuxSlot))
                {
                    *callee = VarTo<RecyclableObject>(objectAtAuxSlot);
                    return true;
                }
            }
            return false;
        }
        return false;
    }